

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O2

string * __thiscall
tinyusdz::AssetResolutionResolver::search_paths_str_abi_cxx11_
          (string *__return_storage_ptr__,AssetResolutionResolver *this)

{
  size_t i;
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(this->_search_paths).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_search_paths).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string AssetResolutionResolver::search_paths_str() const {
  std::string str;

  str += "[ ";
  for (size_t i = 0; i < _search_paths.size(); i++) {
    if (i > 0) {
      str += ", ";
    }
    // TODO: Escape character?
    str += _search_paths[i];
  }
  str += " ]";
  return str;
}